

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm-parse.cc
# Opt level: O3

void InitCommandLine(int argc,char **argv,variables_map *conf)

{
  pointer pbVar1;
  uint uVar2;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar3;
  char *pcVar4;
  typed_value<float,_char> *ptVar5;
  typed_value<unsigned_int,_char> *ptVar6;
  typed_value<double,_char> *ptVar7;
  const_iterator cVar8;
  const_iterator cVar9;
  ostream *poVar10;
  uint uVar11;
  options_description dcmdline_options;
  options_description opts;
  undefined1 local_1a8 [40];
  uint local_180 [10];
  pointer local_158 [2];
  undefined1 local_148 [48];
  void *local_118;
  undefined4 local_110;
  undefined8 local_108;
  undefined4 local_100;
  undefined8 local_f8;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_f0 [24];
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_d8;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [24];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_88 [24];
  void *local_70;
  undefined4 local_68;
  undefined8 local_60;
  undefined4 local_58;
  undefined8 local_50;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_48 [24];
  
  local_158[0] = (pointer)local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"Configuration options","");
  uVar2 = (uint)boost::program_options::options_description::m_default_line_length;
  uVar11 = (uint)boost::program_options::options_description::m_default_line_length >> 1;
  boost::program_options::options_description::options_description
            ((options_description *)local_b0,(string *)local_158,
             (uint)boost::program_options::options_description::m_default_line_length,uVar11);
  if (local_158[0] != (pointer)local_148) {
    operator_delete(local_158[0]);
  }
  local_158[0] = (pointer)boost::program_options::options_description::add_options();
  ptVar3 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_158,(value_semantic *)"training_data,T",(char *)ptVar3);
  ptVar3 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"dev_data,d",(char *)ptVar3);
  ptVar3 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"test_data,p",(char *)ptVar3);
  ptVar5 = boost::program_options::value<float>((float *)0x0);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"dropout,D",(char *)ptVar5);
  ptVar6 = boost::program_options::value<unsigned_int>((uint *)0x0);
  local_180[9] = 1;
  ptVar6 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     (ptVar6,local_180 + 9);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"unk_strategy,o",(char *)ptVar6);
  ptVar7 = boost::program_options::value<double>((double *)0x0);
  local_1a8._0_8_ = (pointer)0x3fc999999999999a;
  ptVar7 = boost::program_options::typed_value<double,_char>::default_value
                     (ptVar7,(double *)local_1a8);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"unk_prob,u",(char *)ptVar7);
  ptVar3 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"model,m",(char *)ptVar3);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,"use_pos_tags,P");
  ptVar6 = boost::program_options::value<unsigned_int>((uint *)0x0);
  local_180[8] = 1;
  ptVar6 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     (ptVar6,local_180 + 8);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"beam_size,b",(char *)ptVar6);
  ptVar6 = boost::program_options::value<unsigned_int>((uint *)0x0);
  local_180[7] = 2;
  ptVar6 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     (ptVar6,local_180 + 7);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)0x12d27e,(char *)ptVar6);
  ptVar6 = boost::program_options::value<unsigned_int>((uint *)0x0);
  local_180[6] = 0x10;
  ptVar6 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     (ptVar6,local_180 + 6);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"action_dim",(char *)ptVar6);
  ptVar6 = boost::program_options::value<unsigned_int>((uint *)0x0);
  local_180[5] = 0x20;
  ptVar6 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     (ptVar6,local_180 + 5);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)0x12d337,(char *)ptVar6);
  ptVar6 = boost::program_options::value<unsigned_int>((uint *)0x0);
  local_180[4] = 0x40;
  ptVar6 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     (ptVar6,local_180 + 4);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"hidden_dim",(char *)ptVar6);
  ptVar6 = boost::program_options::value<unsigned_int>((uint *)0x0);
  local_180[3] = 0x32;
  ptVar6 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     (ptVar6,local_180 + 3);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"pretrained_dim",(char *)ptVar6);
  ptVar6 = boost::program_options::value<unsigned_int>((uint *)0x0);
  local_180[2] = 0xc;
  ptVar6 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     (ptVar6,local_180 + 2);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"pos_dim",(char *)ptVar6);
  ptVar6 = boost::program_options::value<unsigned_int>((uint *)0x0);
  local_180[1] = 10;
  ptVar6 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     (ptVar6,local_180 + 1);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"rel_dim",(char *)ptVar6);
  ptVar6 = boost::program_options::value<unsigned_int>((uint *)0x0);
  local_180[0] = 0x3c;
  ptVar6 = boost::program_options::typed_value<unsigned_int,_char>::default_value(ptVar6,local_180);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"lstm_input_dim",(char *)ptVar6);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,"train,t");
  ptVar3 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"words,w",(char *)ptVar3);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,"use_spelling,S");
  boost::program_options::options_description_easy_init::operator()(pcVar4,"help,h");
  boost::program_options::options_description::options_description
            ((options_description *)local_158,uVar2,uVar11);
  boost::program_options::options_description::add((options_description *)local_158);
  local_d8.super_function_base.vtable = (vtable_base *)0x0;
  local_d8.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_d8.super_function_base.functor._8_8_ = 0;
  local_d8.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)local_1a8,argc,argv,(options_description *)local_158,0,
             &local_d8);
  boost::program_options::store((basic_parsed_options *)local_1a8,conf,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_1a8);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_d8);
  pbVar1 = (pointer)(local_1a8 + 0x10);
  local_1a8._0_8_ = pbVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"help","");
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                  *)(conf + 0x10),(key_type *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pbVar1) {
    operator_delete((void *)local_1a8._0_8_);
  }
  if (cVar8._M_node == (_Base_ptr)(conf + 0x18)) {
    local_1a8._0_8_ = pbVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"training_data","");
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                    *)(conf + 0x10),(key_type *)local_1a8);
    if ((pointer)local_1a8._0_8_ != pbVar1) {
      operator_delete((void *)local_1a8._0_8_);
    }
    if (cVar9._M_node != cVar8._M_node) {
      std::
      vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
      ::~vector(local_f0);
      if (local_118 != (void *)0x0) {
        operator_delete(local_118);
        local_118 = (void *)0x0;
        local_110 = 0;
        local_108 = 0;
        local_100 = 0;
        local_f8 = 0;
      }
      std::
      vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
      ::~vector((vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
                 *)(local_148 + 0x18));
      if (local_158[0] != (pointer)local_148) {
        operator_delete(local_158[0]);
      }
      std::
      vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
      ::~vector(local_48);
      if (local_70 != (void *)0x0) {
        operator_delete(local_70);
        local_70 = (void *)0x0;
        local_68 = 0;
        local_60 = 0;
        local_58 = 0;
        local_50 = 0;
      }
      std::
      vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
      ::~vector(local_88);
      if (local_b0[0] != local_a0) {
        operator_delete(local_b0[0]);
      }
      return;
    }
    std::operator<<((ostream *)&std::cerr,
                    "Please specify --traing_data (-T): this is required to determine the vocabulary mapping, even if the parser is used in prediction mode.\n"
                   );
  }
  else {
    poVar10 = (ostream *)
              boost::program_options::operator<<
                        ((ostream *)&std::cerr,(options_description *)local_158);
    std::endl<char,std::char_traits<char>>(poVar10);
  }
  exit(1);
}

Assistant:

void InitCommandLine(int argc, char** argv, po::variables_map* conf) {
  po::options_description opts("Configuration options");
  opts.add_options()
        ("training_data,T", po::value<string>(), "List of Transitions - Training corpus")
        ("dev_data,d", po::value<string>(), "Development corpus")
        ("test_data,p", po::value<string>(), "Test corpus")
        ("dropout,D", po::value<float>(), "Dropout rate")
        ("unk_strategy,o", po::value<unsigned>()->default_value(1), "Unknown word strategy: 1 = singletons become UNK with probability unk_prob")
        ("unk_prob,u", po::value<double>()->default_value(0.2), "Probably with which to replace singletons with UNK in training data")
        ("model,m", po::value<string>(), "Load saved model from this file")
        ("use_pos_tags,P", "make POS tags visible to parser")
        ("beam_size,b", po::value<unsigned>()->default_value(1), "beam size")
        ("layers", po::value<unsigned>()->default_value(2), "number of LSTM layers")
        ("action_dim", po::value<unsigned>()->default_value(16), "action embedding size")
        ("input_dim", po::value<unsigned>()->default_value(32), "input embedding size")
        ("hidden_dim", po::value<unsigned>()->default_value(64), "hidden dimension")
        ("pretrained_dim", po::value<unsigned>()->default_value(50), "pretrained input dimension")
        ("pos_dim", po::value<unsigned>()->default_value(12), "POS dimension")
        ("rel_dim", po::value<unsigned>()->default_value(10), "relation dimension")
        ("lstm_input_dim", po::value<unsigned>()->default_value(60), "LSTM input dimension")
        ("train,t", "Should training be run?")
        ("words,w", po::value<string>(), "Pretrained word embeddings")
        ("use_spelling,S", "Use spelling model") //Miguel. Spelling model
        ("help,h", "Help");
  po::options_description dcmdline_options;
  dcmdline_options.add(opts);
  po::store(parse_command_line(argc, argv, dcmdline_options), *conf);
  if (conf->count("help")) {
    cerr << dcmdline_options << endl;
    exit(1);
  }
  if (conf->count("training_data") == 0) {
    cerr << "Please specify --traing_data (-T): this is required to determine the vocabulary mapping, even if the parser is used in prediction mode.\n";
    exit(1);
  }
}